

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O0

int Fxu_PairCompare(Fxu_Pair *pPair1,Fxu_Pair *pPair2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int Code;
  int TopVar2;
  int TopVar1;
  Fxu_Lit *pD2C2;
  Fxu_Lit *pD2C1;
  Fxu_Lit *pD1C2;
  Fxu_Lit *pD1C1;
  Fxu_Pair *pPair2_local;
  Fxu_Pair *pPair1_local;
  
  if ((pPair1->nLits1 != pPair2->nLits1) || (pPair1->nLits2 != pPair2->nLits2)) {
    return 0;
  }
  pD1C2 = (pPair1->pCube1->lLits).pHead;
  pD2C1 = (pPair1->pCube2->lLits).pHead;
  pD2C2 = (pPair2->pCube1->lLits).pHead;
  _TopVar2 = (pPair2->pCube2->lLits).pHead;
  bVar1 = 0;
  if (pD1C2 != (Fxu_Lit *)0x0) {
    bVar1 = 8;
  }
  bVar2 = 0;
  if (pD2C1 != (Fxu_Lit *)0x0) {
    bVar2 = 4;
  }
  bVar3 = 0;
  if (pD2C2 != (Fxu_Lit *)0x0) {
    bVar3 = 2;
  }
  if ((byte)(_TopVar2 != (Fxu_Lit *)0x0 | bVar3 | bVar2 | bVar1) == 0xf) {
    bVar1 = 0xf;
    do {
      switch(bVar1) {
      case 0:
        return 1;
      case 1:
        return 0;
      case 2:
        return 0;
      case 3:
        if (pD2C2->iVar != _TopVar2->iVar) {
          return 0;
        }
        pD2C2 = pD2C2->pHNext;
        _TopVar2 = _TopVar2->pHNext;
        break;
      case 4:
        return 0;
      case 5:
        if (pD2C1->iVar != _TopVar2->iVar) {
          return 0;
        }
        pD2C1 = pD2C1->pHNext;
        _TopVar2 = _TopVar2->pHNext;
        break;
      case 6:
        return 0;
      case 7:
        if (pD2C2->iVar < _TopVar2->iVar) {
          local_5c = pD2C2->iVar;
        }
        else {
          local_5c = _TopVar2->iVar;
        }
        if (local_5c == pD2C1->iVar) {
          if (pD2C2->iVar <= _TopVar2->iVar) {
            return 0;
          }
          pD2C1 = pD2C1->pHNext;
          _TopVar2 = _TopVar2->pHNext;
        }
        else {
          if (pD2C1->iVar <= local_5c) {
            return 0;
          }
          if (pD2C2->iVar != _TopVar2->iVar) {
            return 0;
          }
          pD2C2 = pD2C2->pHNext;
          _TopVar2 = _TopVar2->pHNext;
        }
        break;
      case 8:
        return 0;
      case 9:
        return 0;
      case 10:
        if (pD1C2->iVar != pD2C2->iVar) {
          return 0;
        }
        pD1C2 = pD1C2->pHNext;
        pD2C2 = pD2C2->pHNext;
        break;
      case 0xb:
        if (pD2C2->iVar < _TopVar2->iVar) {
          local_60 = pD2C2->iVar;
        }
        else {
          local_60 = _TopVar2->iVar;
        }
        if (local_60 == pD1C2->iVar) {
          if (_TopVar2->iVar <= pD2C2->iVar) {
            return 0;
          }
          pD1C2 = pD1C2->pHNext;
          pD2C2 = pD2C2->pHNext;
        }
        else {
          if (pD1C2->iVar <= local_60) {
            return 0;
          }
          if (pD2C2->iVar != _TopVar2->iVar) {
            return 0;
          }
          pD2C2 = pD2C2->pHNext;
          _TopVar2 = _TopVar2->pHNext;
        }
        break;
      case 0xc:
        if (pD1C2->iVar != pD2C1->iVar) {
          return 0;
        }
        pD1C2 = pD1C2->pHNext;
        pD2C1 = pD2C1->pHNext;
        break;
      case 0xd:
        if (pD1C2->iVar < pD2C1->iVar) {
          local_64 = pD1C2->iVar;
        }
        else {
          local_64 = pD2C1->iVar;
        }
        if (local_64 == _TopVar2->iVar) {
          if (pD1C2->iVar <= pD2C1->iVar) {
            return 0;
          }
          pD2C1 = pD2C1->pHNext;
          _TopVar2 = _TopVar2->pHNext;
        }
        else {
          if (_TopVar2->iVar <= local_64) {
            return 0;
          }
          if (pD1C2->iVar != pD2C1->iVar) {
            return 0;
          }
          pD1C2 = pD1C2->pHNext;
          pD2C1 = pD2C1->pHNext;
        }
        break;
      case 0xe:
        if (pD1C2->iVar < pD2C1->iVar) {
          local_68 = pD1C2->iVar;
        }
        else {
          local_68 = pD2C1->iVar;
        }
        if (local_68 == pD2C2->iVar) {
          if (pD2C1->iVar <= pD1C2->iVar) {
            return 0;
          }
          pD1C2 = pD1C2->pHNext;
          pD2C2 = pD2C2->pHNext;
        }
        else {
          if (pD2C2->iVar <= local_68) {
            return 0;
          }
          if (pD1C2->iVar != pD2C1->iVar) {
            return 0;
          }
          pD1C2 = pD1C2->pHNext;
          pD2C1 = pD2C1->pHNext;
        }
        break;
      case 0xf:
        if (pD1C2->iVar < pD2C1->iVar) {
          local_6c = pD1C2->iVar;
        }
        else {
          local_6c = pD2C1->iVar;
        }
        if (pD2C2->iVar < _TopVar2->iVar) {
          local_70 = pD2C2->iVar;
        }
        else {
          local_70 = _TopVar2->iVar;
        }
        if (local_6c == local_70) {
          if (pD1C2->iVar == pD2C1->iVar) {
            if (pD2C2->iVar != _TopVar2->iVar) {
              return 0;
            }
            pD1C2 = pD1C2->pHNext;
            pD2C1 = pD2C1->pHNext;
            pD2C2 = pD2C2->pHNext;
            _TopVar2 = _TopVar2->pHNext;
          }
          else {
            if (pD2C2->iVar == _TopVar2->iVar) {
              return 0;
            }
            if (pD1C2->iVar < pD2C1->iVar) {
              if (_TopVar2->iVar < pD2C2->iVar) {
                return 0;
              }
              pD1C2 = pD1C2->pHNext;
              pD2C2 = pD2C2->pHNext;
            }
            else {
              if (pD2C2->iVar < _TopVar2->iVar) {
                return 0;
              }
              pD2C1 = pD2C1->pHNext;
              _TopVar2 = _TopVar2->pHNext;
            }
          }
        }
        else if (local_6c < local_70) {
          if (pD1C2->iVar != pD2C1->iVar) {
            return 0;
          }
          pD1C2 = pD1C2->pHNext;
          pD2C1 = pD2C1->pHNext;
        }
        else {
          if (pD2C2->iVar != _TopVar2->iVar) {
            return 0;
          }
          pD2C2 = pD2C2->pHNext;
          _TopVar2 = _TopVar2->pHNext;
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuPair.c"
                      ,0x1ac,"int Fxu_PairCompare(Fxu_Pair *, Fxu_Pair *)");
      }
      bVar1 = 0;
      if (pD1C2 != (Fxu_Lit *)0x0) {
        bVar1 = 8;
      }
      bVar2 = 0;
      if (pD2C1 != (Fxu_Lit *)0x0) {
        bVar2 = 4;
      }
      bVar3 = 0;
      if (pD2C2 != (Fxu_Lit *)0x0) {
        bVar3 = 2;
      }
      bVar1 = _TopVar2 != (Fxu_Lit *)0x0 | bVar3 | bVar2 | bVar1;
    } while( true );
  }
  __assert_fail("Code == 15",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuPair.c"
                ,0x102,"int Fxu_PairCompare(Fxu_Pair *, Fxu_Pair *)");
}

Assistant:

int Fxu_PairCompare( Fxu_Pair * pPair1, Fxu_Pair * pPair2 )
{
	Fxu_Lit * pD1C1, * pD1C2;
	Fxu_Lit * pD2C1, * pD2C2;
	int TopVar1, TopVar2;
	int Code;

	if ( pPair1->nLits1 != pPair2->nLits1 )
		return 0;
	if ( pPair1->nLits2 != pPair2->nLits2 )
		return 0;

	pD1C1 = pPair1->pCube1->lLits.pHead;
	pD1C2 = pPair1->pCube2->lLits.pHead;

	pD2C1 = pPair2->pCube1->lLits.pHead;
	pD2C2 = pPair2->pCube2->lLits.pHead;

	Code  = pD1C1? 8: 0;
	Code |= pD1C2? 4: 0;
	Code |= pD2C1? 2: 0;
	Code |= pD2C2? 1: 0;
	assert( Code == 15 );

	while ( 1 )
	{
		switch ( Code )
		{
		case 0:  // -- --      NULL   NULL     NULL   NULL 
			return 1;
		case 1:  // -- -1      NULL   NULL     NULL   pD2C2
			return 0;
		case 2:  // -- 1-      NULL   NULL     pD2C1  NULL 
			return 0;
		case 3:  // -- 11      NULL   NULL     pD2C1  pD2C2
			if ( pD2C1->iVar != pD2C2->iVar )
				return 0;
			pD2C1 = pD2C1->pHNext;
			pD2C2 = pD2C2->pHNext;
			break;
		case 4:  // -1 --      NULL   pD1C2    NULL   NULL 
			return 0;
		case 5:  // -1 -1      NULL   pD1C2    NULL   pD2C2
			if ( pD1C2->iVar != pD2C2->iVar )
				return 0;
			pD1C2 = pD1C2->pHNext;
			pD2C2 = pD2C2->pHNext;
			break;
		case 6:  // -1 1-      NULL   pD1C2    pD2C1  NULL 
			return 0;
		case 7:  // -1 11      NULL   pD1C2    pD2C1  pD2C2
			TopVar2 = Fxu_Min( pD2C1->iVar, pD2C2->iVar );
			if ( TopVar2 == pD1C2->iVar )
			{
				if ( pD2C1->iVar <= pD2C2->iVar )
					return 0;
				pD1C2 = pD1C2->pHNext;
				pD2C2 = pD2C2->pHNext;
			}
			else if ( TopVar2 < pD1C2->iVar )
			{
				if ( pD2C1->iVar != pD2C2->iVar )
					return 0;
				pD2C1 = pD2C1->pHNext;
				pD2C2 = pD2C2->pHNext;
			}
			else
				return 0;
			break;
		case 8:  // 1- --      pD1C1  NULL     NULL   NULL 
			return 0;
		case 9:  // 1- -1      pD1C1  NULL     NULL   pD2C2
			return 0;
		case 10: // 1- 1-      pD1C1  NULL     pD2C1  NULL 
			if ( pD1C1->iVar != pD2C1->iVar )
				return 0;
			pD1C1 = pD1C1->pHNext;
			pD2C1 = pD2C1->pHNext;
			break;
		case 11: // 1- 11      pD1C1  NULL     pD2C1  pD2C2
			TopVar2 = Fxu_Min( pD2C1->iVar, pD2C2->iVar );
			if ( TopVar2 == pD1C1->iVar )
			{
				if ( pD2C1->iVar >= pD2C2->iVar )
					return 0;
				pD1C1 = pD1C1->pHNext;
				pD2C1 = pD2C1->pHNext;
			}
			else if ( TopVar2 < pD1C1->iVar )
			{
				if ( pD2C1->iVar != pD2C2->iVar )
					return 0;
				pD2C1 = pD2C1->pHNext;
				pD2C2 = pD2C2->pHNext;
			}
			else
				return 0;
			break;
		case 12: // 11 --      pD1C1  pD1C2    NULL   NULL 
			if ( pD1C1->iVar != pD1C2->iVar )
				return 0;
			pD1C1 = pD1C1->pHNext;
			pD1C2 = pD1C2->pHNext;
			break;
		case 13: // 11 -1      pD1C1  pD1C2    NULL   pD2C2
			TopVar1 = Fxu_Min( pD1C1->iVar, pD1C2->iVar );
			if ( TopVar1 == pD2C2->iVar )
			{
				if ( pD1C1->iVar <= pD1C2->iVar )
					return 0;
				pD1C2 = pD1C2->pHNext;
				pD2C2 = pD2C2->pHNext;
			}
			else if ( TopVar1 < pD2C2->iVar )
			{
				if ( pD1C1->iVar != pD1C2->iVar )
					return 0;
				pD1C1 = pD1C1->pHNext;
				pD1C2 = pD1C2->pHNext;
			}
			else
				return 0;
			break;
		case 14: // 11 1-      pD1C1  pD1C2    pD2C1  NULL 
			TopVar1 = Fxu_Min( pD1C1->iVar, pD1C2->iVar );
			if ( TopVar1 == pD2C1->iVar )
			{
				if ( pD1C1->iVar >= pD1C2->iVar )
					return 0;
				pD1C1 = pD1C1->pHNext;
				pD2C1 = pD2C1->pHNext;
			}
			else if ( TopVar1 < pD2C1->iVar )
			{
				if ( pD1C1->iVar != pD1C2->iVar )
					return 0;
				pD1C1 = pD1C1->pHNext;
				pD1C2 = pD1C2->pHNext;
			}
			else
				return 0;
			break;
		case 15: // 11 11      pD1C1  pD1C2    pD2C1  pD2C2
			TopVar1 = Fxu_Min( pD1C1->iVar, pD1C2->iVar );
			TopVar2 = Fxu_Min( pD2C1->iVar, pD2C2->iVar );
			if ( TopVar1 == TopVar2 )
			{
				if ( pD1C1->iVar == pD1C2->iVar )
				{
					if ( pD2C1->iVar != pD2C2->iVar )
						return 0;
					pD1C1 = pD1C1->pHNext;
					pD1C2 = pD1C2->pHNext;
					pD2C1 = pD2C1->pHNext;
					pD2C2 = pD2C2->pHNext;
				}
				else
				{
					if ( pD2C1->iVar == pD2C2->iVar )
						return 0;
					if ( pD1C1->iVar < pD1C2->iVar )
					{
						if ( pD2C1->iVar > pD2C2->iVar )
							return 0;
						pD1C1 = pD1C1->pHNext;
						pD2C1 = pD2C1->pHNext;
					}
					else
					{
						if ( pD2C1->iVar < pD2C2->iVar )
							return 0;
						pD1C2 = pD1C2->pHNext;
						pD2C2 = pD2C2->pHNext;
					}
				}
			}
			else if ( TopVar1 < TopVar2 )
			{
				if ( pD1C1->iVar != pD1C2->iVar )
					return 0;
				pD1C1 = pD1C1->pHNext;
				pD1C2 = pD1C2->pHNext;
			}
			else 
			{
				if ( pD2C1->iVar != pD2C2->iVar )
					return 0;
				pD2C1 = pD2C1->pHNext;
				pD2C2 = pD2C2->pHNext;
			}
			break;
		default:
			assert( 0 );
			break;
		}

		Code  = pD1C1? 8: 0;
		Code |= pD1C2? 4: 0;
		Code |= pD2C1? 2: 0;
		Code |= pD2C2? 1: 0;
	}
	return 1;
}